

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O3

int ps_process_cep(ps_decoder_t *ps,float32 **data,int32 n_frames,int no_search,int full_utt)

{
  int iVar1;
  int iVar2;
  mfcc_t **ptr;
  int32 local_3c;
  float32 **local_38;
  
  local_3c = n_frames;
  local_38 = data;
  if (no_search != 0) {
    acmod_set_grow(ps->acmod,1);
  }
  if (n_frames == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      iVar1 = acmod_process_cep(ps->acmod,&local_38,&local_3c,full_utt);
      if (iVar1 < 0 || no_search != 0) {
        if (iVar1 < 0) {
          return iVar1;
        }
      }
      else {
        iVar1 = ps_search_forward(ps);
        if (iVar1 < 0) {
          return iVar1;
        }
        iVar2 = iVar2 + iVar1;
      }
    } while (local_3c != 0);
  }
  return iVar2;
}

Assistant:

int
ps_process_cep(ps_decoder_t *ps,
               float32 **data,
               int32 n_frames,
               int no_search,
               int full_utt)
{
    int n_searchfr = 0;

#ifdef FIXED_POINT
    mfcc_t **idata, **ptr;
    ptr = idata = ckd_calloc_2d(n_frames,
                                fe_get_output_size(ps->acmod->fe),
                                sizeof(**idata));
    fe_float_to_mfcc(ps->acmod->fe, data, idata, n_frames);
#else
    mfcc_t **ptr = data;
#endif

    if (no_search)
        acmod_set_grow(ps->acmod, TRUE);

    while (n_frames) {
        int nfr;

        /* Process some data into features. */
        if ((nfr = acmod_process_cep(ps->acmod, &ptr,
                                     &n_frames, full_utt)) < 0)
            return nfr;

        /* Score and search as much data as possible */
        if (no_search)
            continue;
        if ((nfr = ps_search_forward(ps)) < 0)
            return nfr;
        n_searchfr += nfr;
    }
#ifdef FIXED_POINT
    ckd_free_2d(idata);
#endif

    return n_searchfr;
}